

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dgSphere.cpp
# Opt level: O2

void __thiscall
dgSphere::SetDimensions
          (dgSphere *this,HaF32 *vertex,HaI32 strideInBytes,HaI32 count,dgMatrix *basis)

{
  float fVar1;
  float fVar2;
  float fVar3;
  undefined1 auVar4 [16];
  dgTemplateVector<float> dVar5;
  undefined1 auVar6 [16];
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  float *pfVar10;
  int iVar11;
  uint uVar12;
  int i;
  int stride;
  uint i_00;
  HaF32 *pHVar13;
  bool bVar14;
  ulong uVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  HaF32 HVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [64];
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  undefined1 auVar28 [64];
  dgVector dVar29;
  HaF32 local_d8;
  dgVector massCenter;
  float local_a8;
  float fStack_a4;
  dgVector dim;
  dgTemplateVector<float> local_88;
  dgTemplateVector<float> local_78;
  undefined1 local_68 [16];
  dgTemplateVector<float> local_50;
  dgVector eigen;
  undefined1 auVar24 [56];
  undefined1 auVar27 [56];
  
  stride = strideInBytes >> 2;
  local_88.m_x = 1.0;
  local_88.m_y = 1.0;
  local_88.m_z = 1.0;
  local_88.m_w = 0.0;
  if (basis == (dgMatrix *)0x0) {
    InternalSphere::Statistics
              (this,(dgVector *)&eigen.super_dgTemplateVector<float>,(dgVector *)&local_88,vertex,
               count,stride);
    uVar12 = 0;
LAB_00d9d4ab:
    iVar11 = 1;
    i_00 = 0;
    while ((i_00 < 3 && (i = iVar11, uVar12 < 6))) {
      while (i != 3) {
        pfVar10 = dgTemplateVector<float>::operator[](&eigen.super_dgTemplateVector<float>,i_00);
        HVar19 = (HaF32)*pfVar10;
        pfVar10 = dgTemplateVector<float>::operator[](&eigen.super_dgTemplateVector<float>,i);
        HVar19 = InternalSphere::AspectRatio(HVar19,(HaF32)*pfVar10);
        i = i + 1;
        if (0.9 < (float)HVar19) {
          pfVar10 = dgTemplateVector<float>::operator[](&local_88,i_00);
          *pfVar10 = *pfVar10 + *pfVar10;
          InternalSphere::Statistics
                    (this,(dgVector *)&eigen.super_dgTemplateVector<float>,(dgVector *)&local_88,
                     vertex,count,stride);
          uVar12 = uVar12 + 1;
          goto LAB_00d9d4ab;
        }
      }
      i_00 = i_00 + 1;
      iVar11 = iVar11 + 1;
    }
  }
  else {
    fVar1 = (basis->m_front).super_dgTemplateVector<float>.m_y;
    fVar2 = (basis->m_front).super_dgTemplateVector<float>.m_z;
    fVar3 = (basis->m_front).super_dgTemplateVector<float>.m_w;
    (this->super_dgMatrix).m_front.super_dgTemplateVector<float>.m_x =
         (basis->m_front).super_dgTemplateVector<float>.m_x;
    (this->super_dgMatrix).m_front.super_dgTemplateVector<float>.m_y = fVar1;
    (this->super_dgMatrix).m_front.super_dgTemplateVector<float>.m_z = fVar2;
    (this->super_dgMatrix).m_front.super_dgTemplateVector<float>.m_w = fVar3;
    fVar1 = (basis->m_up).super_dgTemplateVector<float>.m_y;
    fVar2 = (basis->m_up).super_dgTemplateVector<float>.m_z;
    fVar3 = (basis->m_up).super_dgTemplateVector<float>.m_w;
    (this->super_dgMatrix).m_up.super_dgTemplateVector<float>.m_x =
         (basis->m_up).super_dgTemplateVector<float>.m_x;
    (this->super_dgMatrix).m_up.super_dgTemplateVector<float>.m_y = fVar1;
    (this->super_dgMatrix).m_up.super_dgTemplateVector<float>.m_z = fVar2;
    (this->super_dgMatrix).m_up.super_dgTemplateVector<float>.m_w = fVar3;
    fVar1 = (basis->m_right).super_dgTemplateVector<float>.m_y;
    fVar2 = (basis->m_right).super_dgTemplateVector<float>.m_z;
    fVar3 = (basis->m_right).super_dgTemplateVector<float>.m_w;
    (this->super_dgMatrix).m_right.super_dgTemplateVector<float>.m_x =
         (basis->m_right).super_dgTemplateVector<float>.m_x;
    (this->super_dgMatrix).m_right.super_dgTemplateVector<float>.m_y = fVar1;
    (this->super_dgMatrix).m_right.super_dgTemplateVector<float>.m_z = fVar2;
    (this->super_dgMatrix).m_right.super_dgTemplateVector<float>.m_w = fVar3;
    fVar1 = (basis->m_posit).super_dgTemplateVector<float>.m_y;
    fVar2 = (basis->m_posit).super_dgTemplateVector<float>.m_z;
    fVar3 = (basis->m_posit).super_dgTemplateVector<float>.m_w;
    (this->super_dgMatrix).m_posit.super_dgTemplateVector<float>.m_x =
         (basis->m_posit).super_dgTemplateVector<float>.m_x;
    (this->super_dgMatrix).m_posit.super_dgTemplateVector<float>.m_y = fVar1;
    (this->super_dgMatrix).m_posit.super_dgTemplateVector<float>.m_z = fVar2;
    (this->super_dgMatrix).m_posit.super_dgTemplateVector<float>.m_w = fVar3;
  }
  auVar28 = ZEXT464(0x501502f9);
  pHVar13 = vertex + 2;
  uVar12 = ~(count >> 0x1f) & count;
  local_d8 = -1e+10;
  auVar6 = _DAT_00f50bf0;
  while( true ) {
    bVar14 = uVar12 == 0;
    uVar12 = uVar12 - 1;
    if (bVar14) break;
    auVar24 = (undefined1  [56])0x0;
    auVar27 = (undefined1  [56])0x0;
    dgVector::dgVector(&massCenter,pHVar13[-2],pHVar13[-1],*pHVar13,0.0);
    dVar29 = dgMatrix::UnrotateVector(&this->super_dgMatrix,&massCenter);
    auVar25._0_8_ = dVar29.super_dgTemplateVector<float>._8_8_;
    auVar25._8_56_ = auVar27;
    auVar23._0_8_ = dVar29.super_dgTemplateVector<float>._0_8_;
    auVar23._8_56_ = auVar24;
    pHVar13 = pHVar13 + stride;
    auVar18 = vmaxss_avx(auVar23._0_16_,ZEXT416((uint)local_d8));
    auVar4 = vminss_avx(auVar25._0_16_,ZEXT416((uint)auVar28._0_4_));
    auVar28 = ZEXT1664(auVar4);
    local_d8 = auVar18._0_4_;
    auVar16 = vpermt2ps_avx512vl(auVar23._0_16_,_DAT_00f50c00,auVar25._0_16_);
    uVar7 = vcmpps_avx512vl(auVar16,auVar6,1);
    uVar8 = vcmpps_avx512vl(auVar6,auVar16,1);
    auVar18 = vpmovm2d_avx512vl(uVar8);
    auVar4 = vpmovm2d_avx512vl(uVar7);
    auVar18 = vpblendd_avx2(auVar4,auVar18,0xc);
    uVar15 = vpmovd2m_avx512vl(auVar18);
    bVar14 = (bool)((byte)uVar15 & 1);
    auVar17._0_4_ = (uint)bVar14 * auVar16._0_4_ | (uint)!bVar14 * (int)auVar6._0_4_;
    bVar14 = (bool)((byte)(uVar15 >> 1) & 1);
    auVar17._4_4_ = (uint)bVar14 * auVar16._4_4_ | (uint)!bVar14 * auVar6._4_4_;
    bVar14 = (bool)((byte)(uVar15 >> 2) & 1);
    auVar17._8_4_ = (uint)bVar14 * auVar16._8_4_ | (uint)!bVar14 * auVar6._8_4_;
    bVar14 = (bool)((byte)(uVar15 >> 3) & 1);
    auVar17._12_4_ = (uint)bVar14 * auVar16._12_4_ | (uint)!bVar14 * auVar6._12_4_;
    auVar6 = auVar17;
  }
  auVar18 = vmovshdup_avx(auVar6);
  dgVector::dgVector(&massCenter,auVar18._0_4_,auVar6._0_4_,auVar28._0_4_,0.0);
  uVar7 = massCenter.super_dgTemplateVector<float>._0_8_;
  fVar1 = massCenter.super_dgTemplateVector<float>.m_z;
  local_a8 = massCenter.super_dgTemplateVector<float>.m_x;
  fStack_a4 = massCenter.super_dgTemplateVector<float>.m_y;
  auVar18 = vshufpd_avx(auVar6,auVar6,1);
  auVar6 = vshufps_avx(auVar6,auVar6,0xff);
  dgVector::dgVector(&massCenter,local_d8,auVar6._0_4_,auVar18._0_4_,0.0);
  uVar8 = massCenter.super_dgTemplateVector<float>._0_8_;
  fVar2 = massCenter.super_dgTemplateVector<float>.m_z;
  auVar20._0_4_ = massCenter.super_dgTemplateVector<float>.m_x + local_a8;
  auVar20._4_4_ = massCenter.super_dgTemplateVector<float>.m_y + fStack_a4;
  auVar20._8_8_ = 0;
  local_68 = ZEXT416((uint)massCenter.super_dgTemplateVector<float>.m_w);
  auVar6 = vinsertps_avx(ZEXT416((uint)(massCenter.super_dgTemplateVector<float>.m_z + fVar1)),
                         local_68,0x10);
  dim.super_dgTemplateVector<float> = (dgTemplateVector<float>)vmovlhps_avx(auVar20,auVar6);
  dgVector::dgVector(&massCenter,&dim.super_dgTemplateVector<float>);
  auVar21._8_8_ = 0;
  auVar21._0_4_ = massCenter.super_dgTemplateVector<float>.m_x;
  auVar21._4_4_ = massCenter.super_dgTemplateVector<float>.m_y;
  auVar6._8_4_ = 0x3f000000;
  auVar6._0_8_ = 0x3f0000003f000000;
  auVar6._12_4_ = 0x3f000000;
  auVar18 = vmulps_avx512vl(auVar21,auVar6);
  auVar6 = vinsertps_avx(ZEXT416((uint)(massCenter.super_dgTemplateVector<float>.m_z * 0.5)),
                         ZEXT416((uint)massCenter.super_dgTemplateVector<float>.m_w),0x10);
  auVar27 = ZEXT856(auVar6._8_8_);
  local_78 = (dgTemplateVector<float>)vmovlhps_avx(auVar18,auVar6);
  dgVector::dgVector(&dim,&local_78);
  dVar29 = dim;
  auVar24 = ZEXT856((ulong)dim.super_dgTemplateVector<float>._8_8_);
  massCenter.super_dgTemplateVector<float>.m_x = dim.super_dgTemplateVector<float>.m_x;
  massCenter.super_dgTemplateVector<float>.m_y = dim.super_dgTemplateVector<float>.m_y;
  massCenter.super_dgTemplateVector<float>.m_z = dim.super_dgTemplateVector<float>.m_z;
  massCenter.super_dgTemplateVector<float>.m_w = dim.super_dgTemplateVector<float>.m_w;
  dim = dVar29;
  dVar29 = dgMatrix::TransformVector(&this->super_dgMatrix,&massCenter);
  uVar9 = massCenter.super_dgTemplateVector<float>._0_8_;
  auVar26._0_8_ = dVar29.super_dgTemplateVector<float>._8_8_;
  auVar26._8_56_ = auVar27;
  auVar28._0_8_ = dVar29.super_dgTemplateVector<float>._0_8_;
  auVar28._8_56_ = auVar24;
  dVar5 = (dgTemplateVector<float>)vmovlhps_avx(auVar28._0_16_,auVar26._0_16_);
  (this->super_dgMatrix).m_posit.super_dgTemplateVector<float> = dVar5;
  auVar4._8_8_ = 0;
  massCenter.super_dgTemplateVector<float>.m_x = (float)uVar8;
  massCenter.super_dgTemplateVector<float>.m_y = SUB84(uVar8,4);
  auVar4._0_4_ = massCenter.super_dgTemplateVector<float>.m_x;
  auVar4._4_4_ = massCenter.super_dgTemplateVector<float>.m_y;
  auVar16._8_8_ = 0;
  massCenter.super_dgTemplateVector<float>.m_x = (float)uVar7;
  massCenter.super_dgTemplateVector<float>.m_y = SUB84(uVar7,4);
  auVar16._0_4_ = massCenter.super_dgTemplateVector<float>.m_x;
  auVar16._4_4_ = massCenter.super_dgTemplateVector<float>.m_y;
  auVar18 = vsubps_avx(auVar4,auVar16);
  auVar6 = vinsertps_avx(ZEXT416((uint)(fVar2 - fVar1)),ZEXT416((uint)local_68._0_4_),0x10);
  local_78 = (dgTemplateVector<float>)vmovlhps_avx(auVar18,auVar6);
  massCenter.super_dgTemplateVector<float>._0_8_ = uVar9;
  dgVector::dgVector(&dim,&local_78);
  dVar29 = dim;
  auVar22._8_8_ = 0;
  auVar22._0_4_ = dim.super_dgTemplateVector<float>.m_x;
  auVar22._4_4_ = dim.super_dgTemplateVector<float>.m_y;
  dim.super_dgTemplateVector<float>.m_z = dVar29.super_dgTemplateVector<float>.m_z;
  auVar18._8_4_ = 0x3f000000;
  auVar18._0_8_ = 0x3f0000003f000000;
  auVar18._12_4_ = 0x3f000000;
  auVar18 = vmulps_avx512vl(auVar22,auVar18);
  dim.super_dgTemplateVector<float>.m_w = dVar29.super_dgTemplateVector<float>.m_w;
  auVar6 = vinsertps_avx(ZEXT416((uint)(dim.super_dgTemplateVector<float>.m_z * 0.5)),
                         ZEXT416((uint)dim.super_dgTemplateVector<float>.m_w),0x10);
  local_50 = (dgTemplateVector<float>)vmovlhps_avx(auVar18,auVar6);
  dim = dVar29;
  dgVector::dgVector((dgVector *)&local_78,&local_50);
  dim.super_dgTemplateVector<float> = local_78;
  dVar29.super_dgTemplateVector<float> = dim.super_dgTemplateVector<float>;
  dim.super_dgTemplateVector<float>.m_x = local_78.m_x;
  fVar1 = dim.super_dgTemplateVector<float>.m_x + 0.002;
  dim.super_dgTemplateVector<float>.m_y = local_78.m_y;
  fVar2 = dim.super_dgTemplateVector<float>.m_y + 0.002;
  dim.super_dgTemplateVector<float>.m_z = local_78.m_z;
  fVar3 = dim.super_dgTemplateVector<float>.m_z + 0.002;
  dim.super_dgTemplateVector<float> = dVar29.super_dgTemplateVector<float>;
  SetDimensions(this,(HaF32)fVar1,(HaF32)fVar2,(HaF32)fVar3);
  return;
}

Assistant:

void dgSphere::SetDimensions (const hacd::HaF32 vertex[], hacd::HaI32 strideInBytes, hacd::HaI32 count, const dgMatrix *basis) 
{
	dgVector eigen;
	dgVector scaleVector (hacd::HaF32(1.0f), hacd::HaF32(1.0f), hacd::HaF32(1.0f), hacd::HaF32 (0.0f));

	hacd::HaI32 stride = hacd::HaI32 (strideInBytes / sizeof (hacd::HaF32));
	if (!basis)	{
		InternalSphere::Statistics (*this, eigen, scaleVector, vertex, count, stride);

		hacd::HaI32 k = 0;
		for (hacd::HaI32 i = 0; i < 3; i ++) {
			if (k >= 6) {
				 break;
			}
			for (hacd::HaI32 j = i + 1; j < 3; j ++) {
				hacd::HaF32 aspect = InternalSphere::AspectRatio (eigen[i], eigen[j]);
				if (aspect > hacd::HaF32 (0.9f)) {
					scaleVector[i] *= hacd::HaF32 (2.0f); 
					InternalSphere::Statistics (*this, eigen, scaleVector, vertex, count, stride);
					k ++;
					i = -1;
					break;
				}
			}
		}
	} else {
		*this = *basis;
	}
		
   dgVector min; 
   dgVector max;
   InternalSphere::BoundingBox (*this, vertex, count, stride, min, max);

	dgVector massCenter (max + min);
	massCenter = massCenter.Scale (0.5);
	m_posit = TransformVector (massCenter);

	dgVector dim (max - min);
	dim = dim.Scale (hacd::HaF32(0.5f));
	SetDimensions (dim.m_x + InternalSphere::SPHERE_TOL, 
				   dim.m_y + InternalSphere::SPHERE_TOL, 
				   dim.m_z + InternalSphere::SPHERE_TOL);

}